

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O3

void __thiscall
OpenMPClause::generateDOT
          (OpenMPClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  OpenMPDirective *this_00;
  char *pcVar3;
  OpenMPClause *pOVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_t sVar9;
  size_type *psVar10;
  ulong *puVar11;
  long *plVar12;
  ulong uVar13;
  pointer ppcVar14;
  undefined8 uVar15;
  uint uVar16;
  uint uVar17;
  string __str_3;
  string expr_name;
  string current_line;
  string indent;
  string __str_2;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string clause_kind;
  string clause_label;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  long lStack_1d0;
  ofstream *local_1c8;
  ulong *local_1c0;
  undefined8 local_1b8;
  ulong local_1b0;
  undefined8 uStack_1a8;
  allocator<char> local_199;
  char *local_198;
  undefined8 local_190;
  char local_188;
  undefined7 uStack_187;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  OpenMPClause *local_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  local_198 = &local_188;
  local_190 = 0;
  local_188 = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_1c8 = dot_file;
  std::__cxx11::string::_M_construct((ulong)&local_158,(char)depth);
  switch(this->kind) {
  case OMPC_if:
    break;
  case OMPC_num_threads:
    break;
  case OMPC_default:
    break;
  case OMPC_private:
    break;
  case OMPC_firstprivate:
    break;
  case OMPC_shared:
    break;
  default:
    puts("The clause enum is not supported yet.");
    goto LAB_0015cf27;
  case OMPC_align:
    break;
  case OMPC_proc_bind:
    break;
  case OMPC_allocate:
    break;
  case OMPC_num_teams:
    break;
  case OMPC_thread_limit:
    break;
  case OMPC_collapse:
    break;
  case OMPC_ordered:
    break;
  case OMPC_nowait:
    break;
  case OMPC_order:
    break;
  case OMPC_safelen:
    break;
  case OMPC_simdlen:
    break;
  case OMPC_aligned:
    break;
  case OMPC_nontemporal:
    break;
  case OMPC_uniform:
    break;
  case OMPC_inbranch:
    break;
  case OMPC_notinbranch:
    break;
  case OMPC_bind:
    break;
  case OMPC_inclusive:
    break;
  case OMPC_exclusive:
    break;
  case OMPC_copyprivate:
    break;
  case OMPC_parallel:
    break;
  case OMPC_sections:
    break;
  case OMPC_for:
    break;
  case OMPC_do:
    break;
  case OMPC_taskgroup:
    break;
  case OMPC_initializer:
    break;
  case OMPC_final:
    break;
  case OMPC_untied:
    break;
  case OMPC_mergeable:
    break;
  case OMPC_priority:
    break;
  case OMPC_detach:
    break;
  case OMPC_grainsize:
    break;
  case OMPC_num_tasks:
    break;
  case OMPC_nogroup:
    break;
  case OMPC_reverse_offload:
    break;
  case OMPC_unified_address:
    break;
  case OMPC_unified_shared_memory:
    break;
  case OMPC_dynamic_allocators:
    break;
  case OMPC_map:
    break;
  case OMPC_use_device_ptr:
    break;
  case OMPC_use_device_addr:
    break;
  case OMPC_is_device_ptr:
    break;
  case OMPC_has_device_addr:
    break;
  case OMPC_uses_allocators:
    break;
  case OMPC_link:
    break;
  case OMPC_device_type:
    break;
  case OMPC_acq_rel:
    break;
  case OMPC_release:
    break;
  case OMPC_acquire:
    break;
  case OMPC_read:
    break;
  case OMPC_write:
    break;
  case OMPC_update:
    break;
  case OMPC_capture:
    break;
  case OMPC_seq_cst:
    break;
  case OMPC_relaxed:
    break;
  case OMPC_hint:
    break;
  case OMPC_destroy:
    break;
  case OMPC_threads:
    break;
  case OMPC_simd:
  }
  std::__cxx11::string::append((char *)&local_d8);
LAB_0015cf27:
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,local_d8._M_dataplus._M_p,
             local_d8._M_dataplus._M_p + local_d8._M_string_length);
  local_f8 = &local_e8;
  pcVar2 = (parent_node->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar2,pcVar2 + parent_node->_M_string_length);
  std::__cxx11::string::append((char *)&local_f8);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f8,(ulong)local_d8._M_dataplus._M_p);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_178.field_2._M_allocated_capacity = *psVar10;
    local_178.field_2._8_8_ = plVar7[3];
  }
  else {
    local_178.field_2._M_allocated_capacity = *psVar10;
    local_178._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_178._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  puVar11 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_208.field_2._M_allocated_capacity = *puVar11;
    local_208.field_2._8_8_ = plVar7[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *puVar11;
    local_208._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_208._M_string_length = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar17 = -depth;
  if (0 < depth) {
    uVar17 = depth;
  }
  uVar16 = 1;
  if (9 < uVar17) {
    uVar13 = (ulong)uVar17;
    uVar5 = 4;
    do {
      uVar16 = uVar5;
      uVar6 = (uint)uVar13;
      if (uVar6 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_0015d0ad;
      }
      if (uVar6 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_0015d0ad;
      }
      if (uVar6 < 10000) goto LAB_0015d0ad;
      uVar13 = uVar13 / 10000;
      uVar5 = uVar16 + 4;
    } while (99999 < uVar6);
    uVar16 = uVar16 + 1;
  }
LAB_0015d0ad:
  local_118 = &local_108;
  local_b8 = this;
  std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar16 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)depth >> 0x1f) + (long)local_118),uVar16,uVar17);
  pOVar4 = local_b8;
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    uVar15 = local_208.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_110 + local_208._M_string_length) {
    uVar13 = 0xf;
    if (local_118 != &local_108) {
      uVar13 = local_108;
    }
    if (uVar13 < local_110 + local_208._M_string_length) goto LAB_0015d152;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_118,0,(char *)0x0,(ulong)local_208._M_dataplus._M_p);
  }
  else {
LAB_0015d152:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_118);
  }
  local_228 = &local_218;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_218 = *puVar11;
    lStack_210 = puVar8[3];
  }
  else {
    local_218 = *puVar11;
    local_228 = (ulong *)*puVar8;
  }
  local_220 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_1e8 = &local_1d8;
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1d8 = *puVar11;
    lStack_1d0 = plVar7[3];
  }
  else {
    local_1d8 = *puVar11;
    local_1e8 = (ulong *)*plVar7;
  }
  local_1e0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar17 = -index;
  if (0 < index) {
    uVar17 = index;
  }
  uVar16 = 1;
  if (9 < uVar17) {
    uVar13 = (ulong)uVar17;
    uVar5 = 4;
    do {
      uVar16 = uVar5;
      uVar6 = (uint)uVar13;
      if (uVar6 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_0015d269;
      }
      if (uVar6 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_0015d269;
      }
      if (uVar6 < 10000) goto LAB_0015d269;
      uVar13 = uVar13 / 10000;
      uVar5 = uVar16 + 4;
    } while (99999 < uVar6);
    uVar16 = uVar16 + 1;
  }
LAB_0015d269:
  local_138 = local_128;
  std::__cxx11::string::_M_construct((ulong)&local_138,(char)uVar16 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)index >> 0x1f) + (long)local_138),uVar16,uVar17);
  uVar13 = 0xf;
  if (local_1e8 != &local_1d8) {
    uVar13 = local_1d8;
  }
  if (uVar13 < (ulong)(local_130 + local_1e0)) {
    uVar13 = 0xf;
    if (local_138 != local_128) {
      uVar13 = local_128[0];
    }
    if ((ulong)(local_130 + local_1e0) <= uVar13) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_1e8);
      goto LAB_0015d316;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_138);
LAB_0015d316:
  local_1c0 = &local_1b0;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_1b0 = *puVar11;
    uStack_1a8 = puVar8[3];
  }
  else {
    local_1b0 = *puVar11;
    local_1c0 = (ulong *)*puVar8;
  }
  local_1b8 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_1c0);
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  std::operator+(&local_208,&local_158,parent_node);
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_218 = *puVar11;
    lStack_210 = puVar8[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *puVar11;
    local_228 = (ulong *)*puVar8;
  }
  local_220 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_228,(ulong)local_d8._M_dataplus._M_p);
  local_1e8 = &local_1d8;
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1d8 = *puVar11;
    lStack_1d0 = plVar7[3];
  }
  else {
    local_1d8 = *puVar11;
    local_1e8 = (ulong *)*plVar7;
  }
  local_1e0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_1b0 = *puVar11;
    uStack_1a8 = puVar8[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *puVar11;
    local_1c0 = (ulong *)*puVar8;
  }
  local_1b8 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = local_198;
  if (local_198 == (char *)0x0) {
    std::ios::clear((int)local_1c8 + (int)*(undefined8 *)(*(long *)local_1c8 + -0x18));
  }
  else {
    sVar9 = strlen(local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar3,sVar9);
  }
  std::__cxx11::string::append((char *)&local_158);
  std::operator+(&local_208,&local_158,&local_d8);
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_218 = *puVar11;
    lStack_210 = puVar8[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *puVar11;
    local_228 = (ulong *)*puVar8;
  }
  local_220 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_90[0]);
  local_1e8 = &local_1d8;
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1d8 = *puVar11;
    lStack_1d0 = plVar7[3];
  }
  else {
    local_1d8 = *puVar11;
    local_1e8 = (ulong *)*plVar7;
  }
  local_1e0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_1b0 = *puVar11;
    uStack_1a8 = puVar8[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *puVar11;
    local_1c0 = (ulong *)*puVar8;
  }
  local_1b8 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = local_198;
  if (local_198 == (char *)0x0) {
    std::ios::clear((int)local_1c8 + (int)*(undefined8 *)(*(long *)local_1c8 + -0x18));
  }
  else {
    sVar9 = strlen(local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar3,sVar9);
  }
  if ((pOVar4->kind == OMPC_default) &&
     (this_00 = *(OpenMPDirective **)&pOVar4[1].super_SourceLocation,
     this_00 != (OpenMPDirective *)0x0)) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    OpenMPDirective::generateDOT(this_00,local_1c8,depth + 1,0,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  local_1c0 = &local_1b0;
  local_1b8 = 0;
  local_1b0 = local_1b0 & 0xffffffffffffff00;
  ppcVar14 = (pOVar4->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar14 !=
      (pOVar4->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar17 = 0;
    do {
      local_228 = &local_218;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,local_d8._M_dataplus._M_p,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
      std::__cxx11::string::append((char *)&local_228);
      uVar16 = 1;
      if (9 < uVar17) {
        uVar13 = (ulong)uVar17;
        uVar5 = 4;
        do {
          uVar16 = uVar5;
          uVar6 = (uint)uVar13;
          if (uVar6 < 100) {
            uVar16 = uVar16 - 2;
            goto LAB_0015d99b;
          }
          if (uVar6 < 1000) {
            uVar16 = uVar16 - 1;
            goto LAB_0015d99b;
          }
          if (uVar6 < 10000) goto LAB_0015d99b;
          uVar13 = uVar13 / 10000;
          uVar5 = uVar16 + 4;
        } while (99999 < uVar6);
        uVar16 = uVar16 + 1;
      }
LAB_0015d99b:
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_208,(char)uVar16);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_208._M_dataplus._M_p,uVar16,uVar17);
      uVar13 = 0xf;
      if (local_228 != &local_218) {
        uVar13 = local_218;
      }
      paVar1 = &local_208.field_2;
      if (uVar13 < local_208._M_string_length + local_220) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          uVar15 = local_208.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_208._M_string_length + local_220) goto LAB_0015da09;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_228);
      }
      else {
LAB_0015da09:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_228,(ulong)local_208._M_dataplus._M_p);
      }
      local_1e8 = &local_1d8;
      puVar11 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar11) {
        local_1d8 = *puVar11;
        lStack_1d0 = puVar8[3];
      }
      else {
        local_1d8 = *puVar11;
        local_1e8 = (ulong *)*puVar8;
      }
      local_1e0 = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)puVar11 = 0;
      std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_1e8);
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      std::operator+(&local_178,&local_158,&local_d8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_208.field_2._M_allocated_capacity = *psVar10;
        local_208.field_2._8_8_ = plVar7[3];
        local_208._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar10;
        local_208._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_208._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1c0);
      puVar11 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar11) {
        local_218 = *puVar11;
        lStack_210 = plVar7[3];
        local_228 = &local_218;
      }
      else {
        local_218 = *puVar11;
        local_228 = (ulong *)*plVar7;
      }
      local_220 = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_228);
      puVar11 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar11) {
        local_1d8 = *puVar11;
        lStack_1d0 = plVar7[3];
        local_1e8 = &local_1d8;
      }
      else {
        local_1d8 = *puVar11;
        local_1e8 = (ulong *)*plVar7;
      }
      local_1e0 = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1e8);
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = local_198;
      if (local_198 == (char *)0x0) {
        std::ios::clear((int)local_1c8 + (int)*(undefined8 *)(*(long *)local_1c8 + -0x18));
      }
      else {
        sVar9 = strlen(local_198);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar3,sVar9);
      }
      local_138 = local_128;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_158._M_dataplus._M_p,
                 local_158._M_dataplus._M_p + local_158._M_string_length);
      paVar1 = &local_208.field_2;
      std::__cxx11::string::append((char *)&local_138);
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_1c0);
      local_118 = &local_108;
      puVar11 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar11) {
        local_108 = *puVar11;
        lStack_100 = plVar7[3];
      }
      else {
        local_108 = *puVar11;
        local_118 = (ulong *)*plVar7;
      }
      local_110 = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_f8 = &local_e8;
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_e8 = *plVar12;
        lStack_e0 = plVar7[3];
      }
      else {
        local_e8 = *plVar12;
        local_f8 = (long *)*plVar7;
      }
      local_f0 = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_178.field_2._M_allocated_capacity = *psVar10;
        local_178.field_2._8_8_ = plVar7[3];
      }
      else {
        local_178.field_2._M_allocated_capacity = *psVar10;
        local_178._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_178._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
      puVar11 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_208.field_2._M_allocated_capacity = *puVar11;
        local_208.field_2._8_8_ = plVar7[3];
        local_208._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_208.field_2._M_allocated_capacity = *puVar11;
        local_208._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_208._M_string_length = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,*ppcVar14,&local_199);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        uVar15 = local_208.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_a8 + local_208._M_string_length) {
        uVar13 = 0xf;
        if (local_b0 != local_a0) {
          uVar13 = local_a0[0];
        }
        if (uVar13 < local_a8 + local_208._M_string_length) goto LAB_0015deec;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_b0,0,(char *)0x0,(ulong)local_208._M_dataplus._M_p);
      }
      else {
LAB_0015deec:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_b0);
      }
      local_228 = &local_218;
      puVar11 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar11) {
        local_218 = *puVar11;
        lStack_210 = puVar8[3];
      }
      else {
        local_218 = *puVar11;
        local_228 = (ulong *)*puVar8;
      }
      local_220 = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)puVar11 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_228);
      puVar11 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar11) {
        local_1d8 = *puVar11;
        lStack_1d0 = plVar7[3];
        local_1e8 = &local_1d8;
      }
      else {
        local_1d8 = *puVar11;
        local_1e8 = (ulong *)*plVar7;
      }
      local_1e0 = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1e8);
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if (local_138 != local_128) {
        operator_delete(local_138,local_128[0] + 1);
      }
      pcVar3 = local_198;
      if (local_198 == (char *)0x0) {
        std::ios::clear((int)local_1c8 + (int)*(undefined8 *)(*(long *)local_1c8 + -0x18));
      }
      else {
        sVar9 = strlen(local_198);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar3,sVar9);
      }
      uVar17 = uVar17 + 1;
      ppcVar14 = ppcVar14 + 1;
    } while (ppcVar14 !=
             (local_b8->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
  }
  return;
}

Assistant:

void OpenMPClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string clause_kind;
    std::string indent = std::string(depth, '\t');

    switch (this->getKind()) {
        case OMPC_private:
            clause_kind += "private";
            break;
        case OMPC_firstprivate:
            clause_kind += "firstprivate";
            break;
        case OMPC_shared:
            clause_kind += "shared";
            break;
        case OMPC_initializer:
            clause_kind += "initializer";
            break;
        case OMPC_num_threads:
            clause_kind += "num_threads";
            break;
        case OMPC_align:
            clause_kind += "align";
            break;
        case OMPC_num_teams:
            clause_kind += "num_teams";
            break;
        case OMPC_thread_limit:
            clause_kind += "thread_limit";
            break;
        case OMPC_default:
            clause_kind += "default";
            break;
        case OMPC_collapse:
            clause_kind += "collapse";
            break;
        case OMPC_ordered:
            clause_kind += "ordered";
            break;
        case OMPC_nowait:
            clause_kind += "nowait";
            break;
        case OMPC_allocate:
            clause_kind += "allocate";
            break;
        case OMPC_order:
            clause_kind += "order";
            break;
        case OMPC_safelen:
            clause_kind += "safelen";
            break;
        case OMPC_simdlen:
            clause_kind += "simdlen";
            break;
        case OMPC_aligned:
            clause_kind += "aligned";
            break;
        case OMPC_nontemporal:
            clause_kind += "nontemporal";
            break;
        case OMPC_uniform:
            clause_kind += "uniform";
            break;
        case OMPC_inbranch:
            clause_kind += "inbranch";
            break;
        case OMPC_notinbranch:
            clause_kind += "notinbranch";
            break;
        case OMPC_proc_bind:
            clause_kind += "proc_bind";
            break;
        case OMPC_bind:
            clause_kind += "bind";
            break; 
        case OMPC_inclusive:
            clause_kind += "inclusive";
            break;        
        case OMPC_exclusive:
            clause_kind += "exclusive";
            break;
        case OMPC_copyprivate:
            clause_kind += "copyprivate";
            break;
        case OMPC_parallel:
            clause_kind += "parallel";
            break;
        case OMPC_sections:
            clause_kind += "sections";
            break;
        case OMPC_for:
            clause_kind += "for";
            break;
        case OMPC_do:
            clause_kind += "do";
            break;
        case OMPC_taskgroup:
            clause_kind += "taskgroup";
            break;
        case OMPC_if:
            clause_kind += "if";
            break;
        case OMPC_reverse_offload:
            clause_kind += "reverse_offload";
            break;
        case OMPC_unified_address:
            clause_kind += "unified_address";
            break;
        case OMPC_unified_shared_memory:
            clause_kind += "unified_shared_memory";
            break;
        case OMPC_dynamic_allocators:
            clause_kind += "dynamic_allocators";
            break;
        case OMPC_final:
            clause_kind += "final";
            break;
        case OMPC_untied:
            clause_kind += "untied";
            break;
        case OMPC_mergeable:
            clause_kind += "mergeable";
            break;
        case OMPC_priority:
            clause_kind += "priority";
            break;
        case OMPC_detach:
            clause_kind += "detach";
            break;
        case OMPC_grainsize:
            clause_kind += "grainsize";
            break;
        case OMPC_num_tasks:
            clause_kind += "num_tasks";
            break;
        case OMPC_nogroup:
            clause_kind += "nogroup";
            break;
        case OMPC_map:
            clause_kind += "map";
            break;
        case OMPC_use_device_ptr:
            clause_kind += "use_device_ptr";
            break;
        case OMPC_use_device_addr:
            clause_kind += "use_device_addr";
            break;
        case OMPC_is_device_ptr:
            clause_kind += "is_device_ptr";
            break;
        case OMPC_has_device_addr:
            clause_kind += "has_device_addr";
            break;
        case OMPC_link:
            clause_kind += "link";
            break;
        case OMPC_device_type:
            clause_kind += "device_type";
            break;
        case OMPC_acq_rel:
            clause_kind += "acq_rel";
            break;
        case OMPC_release:
            clause_kind += "release";
            break;
        case OMPC_acquire:
            clause_kind += "acquire";
            break;
        case OMPC_read:
            clause_kind += "read";
            break;
        case OMPC_write:
            clause_kind += "write";
            break;
        case OMPC_update:
            clause_kind += "update";
            break;
        case OMPC_capture:
            clause_kind += "capture";
            break;
        case OMPC_seq_cst:
            clause_kind += "seq_cst";
            break;
        case OMPC_relaxed:
            clause_kind += "relaxed";
            break;
        case OMPC_hint:
            clause_kind += "hint";
            break;
        case OMPC_destroy:
            clause_kind += "destroy";
            break;
        case OMPC_threads:
            clause_kind += "threads";
            break;
        case OMPC_simd:
            clause_kind += "simd";
            break;
        case OMPC_uses_allocators:
            clause_kind += "uses_allocators";
            break;
        default:
            printf("The clause enum is not supported yet.\n");
    }
    //parent_node = parent_node.substr(0, parent_node.size()-1);
    std::string clause_label = clause_kind;
    clause_kind = parent_node + "_" + clause_kind + "_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    current_line = indent + clause_kind + " [label = \"" + clause_label + + "\"]\n";
    dot_file << current_line.c_str();

    if (this->getKind() == OMPC_default) {
        OpenMPDirective* variant_directive = ((OpenMPDefaultClause*)this)->getVariantDirective();
        if (variant_directive != NULL) {
            variant_directive->generateDOT(dot_file, depth+1, 0, clause_kind, "");
        };
    };

    std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + "expr" + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}